

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_vector.c
# Opt level: O0

exr_result_t
exr_attr_float_vector_init_static
          (exr_context_t ctxt,exr_attr_float_vector_t *fv,float *arr,int32_t nent)

{
  int in_ECX;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  _internal_exr_context *pctxt;
  exr_attr_float_vector_t nil;
  undefined8 local_38;
  undefined8 local_30;
  int local_24;
  long local_20;
  int *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_38,0,0x10);
  if (local_10 == 0) {
    local_4 = 2;
  }
  else if (local_24 < 0) {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,
                         "Received request to allocate negative sized float vector (%d entries)",
                         local_24);
  }
  else if (local_18 == (int *)0x0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid reference to float vector object to initialize");
  }
  else if (local_20 == 0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid reference to float array object to initialize");
  }
  else {
    *(undefined8 *)local_18 = local_38;
    *(undefined8 *)(local_18 + 2) = local_30;
    *(long *)(local_18 + 2) = local_20;
    *local_18 = local_24;
    local_18[1] = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_float_vector_init_static (
    exr_context_t            ctxt,
    exr_attr_float_vector_t* fv,
    const float*             arr,
    int32_t                  nent)
{
    exr_attr_float_vector_t nil = {0};

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (nent < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized float vector (%d entries)",
            nent);
    if (!fv)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to float vector object to initialize");
    if (!arr)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to float array object to initialize");

    *fv            = nil;
    fv->arr        = arr;
    fv->length     = nent;
    fv->alloc_size = 0;
    return EXR_ERR_SUCCESS;
}